

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

ActivationSigmoidHard * __thiscall
CoreML::Specification::ActivationSigmoidHard::New(ActivationSigmoidHard *this,Arena *arena)

{
  ActivationSigmoidHard *this_00;
  
  this_00 = (ActivationSigmoidHard *)operator_new(0x20);
  ActivationSigmoidHard(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ActivationSigmoidHard>(arena,this_00);
  }
  return this_00;
}

Assistant:

ActivationSigmoidHard* ActivationSigmoidHard::New(::google::protobuf::Arena* arena) const {
  ActivationSigmoidHard* n = new ActivationSigmoidHard;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}